

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_a64_mask_sse4.c
# Opt level: O2

void blend_a64_mask_bn_sx_w4_sse4_1
               (uint16_t *dst,uint32_t dst_stride,uint16_t *src0,uint32_t src0_stride,uint16_t *src1
               ,uint32_t src1_stride,uint8_t *mask,uint32_t mask_stride,int h,blend_unit_fn blend)

{
  ulong uVar1;
  long lVar2;
  uint16_t *puVar3;
  undefined4 in_register_0000008c;
  longlong lVar4;
  uint16_t *puVar5;
  undefined1 uVar6;
  undefined1 uVar7;
  undefined8 extraout_XMM0_Qa;
  undefined1 auVar8 [16];
  __m128i alVar9;
  __m128i alVar10;
  
  lVar4 = CONCAT44(in_register_0000008c,src1_stride);
  lVar2 = (ulong)src1_stride * 2;
  puVar3 = src1;
  puVar5 = src0;
  do {
    uVar1 = *(ulong *)mask;
    auVar8._8_8_ = 0;
    auVar8._0_8_ = uVar1;
    uVar6 = (undefined1)(uVar1 >> 8);
    pavgb(uVar6,(char)uVar1);
    uVar7 = (undefined1)(uVar1 >> 0x10);
    pavgb(uVar7,uVar6);
    uVar6 = (undefined1)(uVar1 >> 0x18);
    pavgb(uVar6,uVar7);
    uVar7 = (undefined1)(uVar1 >> 0x20);
    pavgb(uVar7,uVar6);
    uVar6 = (undefined1)(uVar1 >> 0x28);
    pavgb(uVar6,uVar7);
    uVar7 = (undefined1)(uVar1 >> 0x30);
    pavgb(uVar7,uVar6);
    uVar6 = (undefined1)(uVar1 >> 0x38);
    pavgb(uVar6,uVar7);
    pavgb(0,uVar6);
    pavgb(0,0);
    pavgb(0,0);
    pavgb(0,0);
    pavgb(0,0);
    pavgb(0,0);
    pavgb(0,0);
    pavgb(0,0);
    pavgb(0,0);
    pmovsxbw(auVar8,0x4040404040404040);
    alVar9[1] = lVar2;
    alVar9[0] = (longlong)src0;
    alVar10[1] = lVar4;
    alVar10[0] = (longlong)puVar3;
    alVar9 = (*blend)(puVar5,src1,alVar9,alVar10);
    src0 = alVar9[1];
    *(undefined8 *)dst = extraout_XMM0_Qa;
    mask = (uint8_t *)((long)mask + (ulong)mask_stride);
    src1 = src1 + src1_stride;
    puVar5 = puVar5 + src0_stride;
    dst = dst + dst_stride;
    h = h + -1;
  } while (h != 0);
  return;
}

Assistant:

static inline void blend_a64_mask_bn_sx_w4_sse4_1(
    uint16_t *dst, uint32_t dst_stride, const uint16_t *src0,
    uint32_t src0_stride, const uint16_t *src1, uint32_t src1_stride,
    const uint8_t *mask, uint32_t mask_stride, int h, blend_unit_fn blend) {
  const __m128i v_zmask_b =
      _mm_set_epi8(0, -1, 0, -1, 0, -1, 0, -1, 0, -1, 0, -1, 0, -1, 0, -1);
  const __m128i v_maxval_w = _mm_set1_epi16(AOM_BLEND_A64_MAX_ALPHA);

  do {
    const __m128i v_r_b = xx_loadl_64(mask);
    const __m128i v_a_b = _mm_avg_epu8(v_r_b, _mm_srli_si128(v_r_b, 1));

    const __m128i v_m0_w = _mm_and_si128(v_a_b, v_zmask_b);
    const __m128i v_m1_w = _mm_sub_epi16(v_maxval_w, v_m0_w);

    const __m128i v_res_w = blend(src0, src1, v_m0_w, v_m1_w);

    xx_storel_64(dst, v_res_w);

    dst += dst_stride;
    src0 += src0_stride;
    src1 += src1_stride;
    mask += mask_stride;
  } while (--h);
}